

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O2

duckdb_state duckdb_appender_add_column(duckdb_appender appender,char *name)

{
  type pAVar1;
  duckdb_state dVar2;
  allocator local_c1;
  string local_c0 [32];
  ErrorData error;
  
  dVar2 = DuckDBError;
  if ((appender != (duckdb_appender)0x0) && (*(long *)appender != 0)) {
    pAVar1 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
             operator*((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                       appender);
    std::__cxx11::string::string(local_c0,name,&local_c1);
    (*(pAVar1->super_BaseAppender)._vptr_BaseAppender[2])(pAVar1,local_c0);
    std::__cxx11::string::~string(local_c0);
    dVar2 = DuckDBSuccess;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_appender_add_column(duckdb_appender appender, const char *name) {
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.AddColumn(name); });
}